

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroIO.cpp
# Opt level: O0

void __thiscall
OpenMD::HydroIO::interpretHydroProp
          (HydroIO *this,HydroProp *hp,RealType viscosity,RealType temperature)

{
  ostream *poVar1;
  ostream *m;
  ostream *this_00;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  Mat3x3d Ddrr;
  Mat3x3d Ddrt;
  Mat3x3d Ddtr;
  Mat3x3d Ddtt;
  Mat6x6d Dd;
  Mat3x3d Xidrr;
  Mat3x3d Xidtr;
  Mat3x3d Xidrt;
  Mat3x3d Xidtt;
  Mat6x6d Xid;
  Vector3d cod;
  Mat3x3d Drrr;
  Mat3x3d Drtr;
  Mat3x3d Drrt;
  Mat3x3d Drtt;
  Mat6x6d Dr;
  Mat3x3d Xirrr;
  Mat3x3d Xirtr;
  Mat3x3d Xirrt;
  Mat3x3d Xirtt;
  Mat6x6d Xi;
  Vector3d ror;
  HydroProp *in_stack_fffffffffffff1f8;
  SquareMatrix<double,_6> *in_stack_fffffffffffff200;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffff208;
  ostream *in_stack_fffffffffffff210;
  undefined8 in_stack_fffffffffffff218;
  RectMatrix<double,_6U,_6U> *in_stack_fffffffffffff220;
  SquareMatrix3<double> *in_stack_fffffffffffff228;
  RealType in_stack_fffffffffffff340;
  HydroProp *in_stack_fffffffffffff348;
  RealType in_stack_fffffffffffff670;
  HydroProp *in_stack_fffffffffffff678;
  Vector3d *in_stack_fffffffffffff820;
  HydroProp *in_stack_fffffffffffff828;
  RealType in_stack_fffffffffffff948;
  Vector3d *in_stack_fffffffffffff950;
  HydroProp *in_stack_fffffffffffff958;
  
  HydroProp::getCenterOfResistance(in_stack_fffffffffffff1f8);
  SquareMatrix<double,_6>::SquareMatrix(in_stack_fffffffffffff200);
  HydroProp::getResistanceTensor(in_stack_fffffffffffff1f8);
  SquareMatrix<double,_6>::operator=
            (in_stack_fffffffffffff200,(SquareMatrix<double,_6> *)in_stack_fffffffffffff1f8);
  SquareMatrix<double,_6>::~SquareMatrix((SquareMatrix<double,_6> *)0x3d2bd6);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x3d2be3);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x3d2bf2);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x3d2c01);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x3d2c10);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            (in_stack_fffffffffffff220,(uint)((ulong)in_stack_fffffffffffff218 >> 0x20),
             (uint)in_stack_fffffffffffff218,(SquareMatrix3<double> *)in_stack_fffffffffffff210);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            (in_stack_fffffffffffff220,(uint)((ulong)in_stack_fffffffffffff218 >> 0x20),
             (uint)in_stack_fffffffffffff218,(SquareMatrix3<double> *)in_stack_fffffffffffff210);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            (in_stack_fffffffffffff220,(uint)((ulong)in_stack_fffffffffffff218 >> 0x20),
             (uint)in_stack_fffffffffffff218,(SquareMatrix3<double> *)in_stack_fffffffffffff210);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            (in_stack_fffffffffffff220,(uint)((ulong)in_stack_fffffffffffff218 >> 0x20),
             (uint)in_stack_fffffffffffff218,(SquareMatrix3<double> *)in_stack_fffffffffffff210);
  SquareMatrix<double,_6>::SquareMatrix(in_stack_fffffffffffff200);
  HydroProp::getDiffusionTensor(in_stack_fffffffffffff348,in_stack_fffffffffffff340);
  SquareMatrix<double,_6>::operator=
            (in_stack_fffffffffffff200,(SquareMatrix<double,_6> *)in_stack_fffffffffffff1f8);
  SquareMatrix<double,_6>::~SquareMatrix((SquareMatrix<double,_6> *)0x3d2cda);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x3d2ce7);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x3d2cf6);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x3d2d05);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x3d2d14);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            (in_stack_fffffffffffff220,(uint)((ulong)in_stack_fffffffffffff218 >> 0x20),
             (uint)in_stack_fffffffffffff218,(SquareMatrix3<double> *)in_stack_fffffffffffff210);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            (in_stack_fffffffffffff220,(uint)((ulong)in_stack_fffffffffffff218 >> 0x20),
             (uint)in_stack_fffffffffffff218,(SquareMatrix3<double> *)in_stack_fffffffffffff210);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            (in_stack_fffffffffffff220,(uint)((ulong)in_stack_fffffffffffff218 >> 0x20),
             (uint)in_stack_fffffffffffff218,(SquareMatrix3<double> *)in_stack_fffffffffffff210);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            (in_stack_fffffffffffff220,(uint)((ulong)in_stack_fffffffffffff218 >> 0x20),
             (uint)in_stack_fffffffffffff218,(SquareMatrix3<double> *)in_stack_fffffffffffff210);
  std::operator<<((ostream *)&std::cout,"\n");
  std::operator<<((ostream *)&std::cout,"-----------------------------------------\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"viscosity = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_XMM0_Qa);
  poVar1 = std::operator<<(poVar1," Poise");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"temperature = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_XMM1_Qa);
  poVar1 = std::operator<<(poVar1," K");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"-----------------------------------------\n");
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "The centers are based on the elements generated by Hydro ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"which have been placed in an .xyz or .stl file.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "They are not based on the geometry in the .omd file.\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"-----------------------------------------\n\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"Center of resistance :");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = OpenMD::operator<<(in_stack_fffffffffffff210,
                              (Vector<double,_3U> *)in_stack_fffffffffffff208);
  poVar1 = std::operator<<(poVar1,"\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"-----------------------------------------\n\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"Resistance tensor at center of resistance\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"translation [kcal.fs/(mol.A^2)]:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = OpenMD::operator<<(in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"rotation-translation [kcal.fs/(mol.A.radian)]:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  SquareMatrix3<double>::transpose(in_stack_fffffffffffff228);
  poVar1 = OpenMD::operator<<(in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3d3119);
  poVar1 = std::operator<<((ostream *)&std::cout,"translation-rotation [kcal.fs/(mol.A.radian)]:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = OpenMD::operator<<(in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"rotation [kcal.fs/(mol.radian^2)]:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = OpenMD::operator<<(in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"-----------------------------------------\n\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"Diffusion tensor at center of resistance\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"translation (A^2 / fs):");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = OpenMD::operator<<(in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"rotation-translation (A.radian / fs):");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = OpenMD::operator<<(in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"translation-rotation (A.radian / fs):");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = OpenMD::operator<<(in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"rotation (radian^2 / fs):");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = OpenMD::operator<<(in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"-----------------------------------------\n\n");
  HydroProp::getCenterOfDiffusion(in_stack_fffffffffffff678,in_stack_fffffffffffff670);
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_fffffffffffff200,
             (Vector3<double> *)in_stack_fffffffffffff1f8);
  HydroProp::getResistanceTensorAtPos(in_stack_fffffffffffff828,in_stack_fffffffffffff820);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x3d3453);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x3d3462);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x3d3471);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x3d3480);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            (in_stack_fffffffffffff220,(uint)((ulong)in_stack_fffffffffffff218 >> 0x20),
             (uint)in_stack_fffffffffffff218,(SquareMatrix3<double> *)in_stack_fffffffffffff210);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            (in_stack_fffffffffffff220,(uint)((ulong)in_stack_fffffffffffff218 >> 0x20),
             (uint)in_stack_fffffffffffff218,(SquareMatrix3<double> *)in_stack_fffffffffffff210);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            (in_stack_fffffffffffff220,(uint)((ulong)in_stack_fffffffffffff218 >> 0x20),
             (uint)in_stack_fffffffffffff218,(SquareMatrix3<double> *)in_stack_fffffffffffff210);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            (in_stack_fffffffffffff220,(uint)((ulong)in_stack_fffffffffffff218 >> 0x20),
             (uint)in_stack_fffffffffffff218,(SquareMatrix3<double> *)in_stack_fffffffffffff210);
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_fffffffffffff200,
             (Vector3<double> *)in_stack_fffffffffffff1f8);
  HydroProp::getDiffusionTensorAtPos
            (in_stack_fffffffffffff958,in_stack_fffffffffffff950,in_stack_fffffffffffff948);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x3d3553);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x3d3562);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x3d3571);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x3d3580);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            (in_stack_fffffffffffff220,(uint)((ulong)in_stack_fffffffffffff218 >> 0x20),
             (uint)in_stack_fffffffffffff218,(SquareMatrix3<double> *)in_stack_fffffffffffff210);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            (in_stack_fffffffffffff220,(uint)((ulong)in_stack_fffffffffffff218 >> 0x20),
             (uint)in_stack_fffffffffffff218,(SquareMatrix3<double> *)in_stack_fffffffffffff210);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            (in_stack_fffffffffffff220,(uint)((ulong)in_stack_fffffffffffff218 >> 0x20),
             (uint)in_stack_fffffffffffff218,(SquareMatrix3<double> *)in_stack_fffffffffffff210);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            (in_stack_fffffffffffff220,(uint)((ulong)in_stack_fffffffffffff218 >> 0x20),
             (uint)in_stack_fffffffffffff218,(SquareMatrix3<double> *)in_stack_fffffffffffff210);
  poVar1 = std::operator<<((ostream *)&std::cout,"Center of diffusion: ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = OpenMD::operator<<(in_stack_fffffffffffff210,
                              (Vector<double,_3U> *)in_stack_fffffffffffff208);
  poVar1 = std::operator<<(poVar1,"\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"-----------------------------------------\n\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"Diffusion tensor at center of diffusion \n ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"translation (A^2 / fs) :");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = OpenMD::operator<<(in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"rotation-translation (A.radian / fs):");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  SquareMatrix3<double>::transpose(in_stack_fffffffffffff228);
  poVar1 = OpenMD::operator<<(in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3d37a4);
  poVar1 = std::operator<<((ostream *)&std::cout,"translation-rotation (A.radian / fs):");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = OpenMD::operator<<(in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"rotation (radian^2 / fs):");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = OpenMD::operator<<(in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"-----------------------------------------\n\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"Resistance tensor at center of diffusion \n ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"translation [kcal.fs/(mol.A^2)]:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = OpenMD::operator<<(in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"rotation-translation [kcal.fs/(mol.A.radian)]:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = OpenMD::operator<<(in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"translation-rotation [kcal.fs/(mol.A.radian)]:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  m = OpenMD::operator<<(poVar1,in_stack_fffffffffffff208);
  std::ostream::operator<<(m,std::endl<char,std::char_traits<char>>);
  this_00 = std::operator<<((ostream *)&std::cout,"rotation [kcal.fs/(mol.radian^2)]:");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  poVar1 = OpenMD::operator<<(poVar1,(RectMatrix<double,_3U,_3U> *)m);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"-----------------------------------------\n\n");
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3d3a28);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3d3a35);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3d3a42);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3d3a4f);
  SquareMatrix<double,_6>::~SquareMatrix((SquareMatrix<double,_6> *)0x3d3a5c);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3d3a69);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3d3a76);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3d3a83);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3d3a90);
  SquareMatrix<double,_6>::~SquareMatrix((SquareMatrix<double,_6> *)0x3d3a9d);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3d3aaa);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3d3ab7);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3d3ac4);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3d3ad1);
  SquareMatrix<double,_6>::~SquareMatrix((SquareMatrix<double,_6> *)0x3d3ade);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3d3aeb);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3d3af8);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3d3b05);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3d3b12);
  SquareMatrix<double,_6>::~SquareMatrix((SquareMatrix<double,_6> *)0x3d3b1f);
  return;
}

Assistant:

void HydroIO::interpretHydroProp(HydroProp* hp, RealType viscosity,
                                   RealType temperature) {
    Vector3d ror = hp->getCenterOfResistance();

    Mat6x6d Xi;
    Xi = hp->getResistanceTensor();
    Mat3x3d Xirtt;
    Mat3x3d Xirrt;
    Mat3x3d Xirtr;
    Mat3x3d Xirrr;

    Xi.getSubMatrix(0, 0, Xirtt);
    Xi.getSubMatrix(0, 3, Xirrt);
    Xi.getSubMatrix(3, 0, Xirtr);
    Xi.getSubMatrix(3, 3, Xirrr);

    Mat6x6d Dr;
    Dr = hp->getDiffusionTensor(temperature);

    Mat3x3d Drtt;
    Mat3x3d Drrt;
    Mat3x3d Drtr;
    Mat3x3d Drrr;

    Dr.getSubMatrix(0, 0, Drtt);
    Dr.getSubMatrix(0, 3, Drrt);
    Dr.getSubMatrix(3, 0, Drtr);
    Dr.getSubMatrix(3, 3, Drrr);

    std::cout << "\n";
    std::cout << "-----------------------------------------\n";
    std::cout << "viscosity = " << viscosity << " Poise" << std::endl;
    std::cout << "temperature = " << temperature << " K" << std::endl;
    std::cout << "-----------------------------------------\n";
    std::cout << "The centers are based on the elements generated by Hydro "
              << std::endl;
    std::cout << "which have been placed in an .xyz or .stl file." << std::endl;
    std::cout << "They are not based on the geometry in the .omd file.\n"
              << std::endl;
    std::cout << "-----------------------------------------\n\n";
    std::cout << "Center of resistance :" << std::endl;
    std::cout << ror << "\n" << std::endl;
    std::cout << "-----------------------------------------\n\n";
    std::cout << "Resistance tensor at center of resistance\n" << std::endl;
    std::cout << "translation [kcal.fs/(mol.A^2)]:" << std::endl;
    std::cout << Xirtt << std::endl;
    std::cout << "rotation-translation [kcal.fs/(mol.A.radian)]:" << std::endl;
    std::cout << Xirtr.transpose() << std::endl;
    std::cout << "translation-rotation [kcal.fs/(mol.A.radian)]:" << std::endl;
    std::cout << Xirtr << std::endl;
    std::cout << "rotation [kcal.fs/(mol.radian^2)]:" << std::endl;
    std::cout << Xirrr << std::endl;
    std::cout << "-----------------------------------------\n\n";
    std::cout << "Diffusion tensor at center of resistance\n" << std::endl;
    std::cout << "translation (A^2 / fs):" << std::endl;
    std::cout << Drtt << std::endl;
    std::cout << "rotation-translation (A.radian / fs):" << std::endl;
    std::cout << Drrt << std::endl;
    std::cout << "translation-rotation (A.radian / fs):" << std::endl;
    std::cout << Drtr << std::endl;
    std::cout << "rotation (radian^2 / fs):" << std::endl;
    std::cout << Drrr << std::endl;
    std::cout << "-----------------------------------------\n\n";

    // calculate center of diffusion using the same arbitrary origin as above
    // (from the generated geometry file .xyz)

    Vector3d cod = hp->getCenterOfDiffusion(temperature);
    Mat6x6d Xid  = hp->getResistanceTensorAtPos(cod);

    Mat3x3d Xidtt;
    Mat3x3d Xidrt;
    Mat3x3d Xidtr;
    Mat3x3d Xidrr;

    Xid.getSubMatrix(0, 0, Xidtt);
    Xid.getSubMatrix(0, 3, Xidrt);
    Xid.getSubMatrix(3, 0, Xidtr);
    Xid.getSubMatrix(3, 3, Xidrr);

    // calculate Diffusion Tensor at center of diffusion
    Mat6x6d Dd = hp->getDiffusionTensorAtPos(cod, temperature);

    Mat3x3d Ddtt;
    Mat3x3d Ddtr;
    Mat3x3d Ddrt;
    Mat3x3d Ddrr;

    Dd.getSubMatrix(0, 0, Ddtt);
    Dd.getSubMatrix(0, 3, Ddrt);
    Dd.getSubMatrix(3, 0, Ddtr);
    Dd.getSubMatrix(3, 3, Ddrr);

    std::cout << "Center of diffusion: " << std::endl;
    std::cout << cod << "\n" << std::endl;
    std::cout << "-----------------------------------------\n\n";
    std::cout << "Diffusion tensor at center of diffusion \n " << std::endl;
    std::cout << "translation (A^2 / fs) :" << std::endl;
    std::cout << Ddtt << std::endl;
    std::cout << "rotation-translation (A.radian / fs):" << std::endl;
    std::cout << Ddtr.transpose() << std::endl;
    std::cout << "translation-rotation (A.radian / fs):" << std::endl;
    std::cout << Ddtr << std::endl;
    std::cout << "rotation (radian^2 / fs):" << std::endl;
    std::cout << Ddrr << std::endl;
    std::cout << "-----------------------------------------\n\n";
    std::cout << "Resistance tensor at center of diffusion \n " << std::endl;
    std::cout << "translation [kcal.fs/(mol.A^2)]:" << std::endl;
    std::cout << Xidtt << std::endl;
    std::cout << "rotation-translation [kcal.fs/(mol.A.radian)]:" << std::endl;
    std::cout << Xidrt << std::endl;
    std::cout << "translation-rotation [kcal.fs/(mol.A.radian)]:" << std::endl;
    std::cout << Xidtr << std::endl;
    std::cout << "rotation [kcal.fs/(mol.radian^2)]:" << std::endl;
    std::cout << Xidrr << std::endl;
    std::cout << "-----------------------------------------\n\n";
  }